

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_atomic_cmpxchg_i64_mips64
               (TCGContext_conflict5 *tcg_ctx,TCGv_i64 retv,TCGv_i64 addr,TCGv_i64 cmpv,
               TCGv_i64 newv,TCGArg idx,MemOp_conflict1 memop)

{
  MemOp_conflict1 opc;
  TCGv_i64 val;
  TCGv_i64 ret;
  TCGv_i32 ret_00;
  TCGv_i32 ret_01;
  TCGv_i32 retv_00;
  uintptr_t o_1;
  uintptr_t o_3;
  uintptr_t o;
  
  opc = tcg_canonicalize_memop(memop,true,false);
  if ((tcg_ctx->tb_cflags & 0x80000) == 0) {
    val = tcg_temp_new_i64(tcg_ctx);
    ret = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_ext_i64(tcg_ctx,ret,cmpv,opc & MO_64);
    tcg_gen_qemu_ld_i64_mips64(tcg_ctx,val,addr,idx,opc & ~MO_ASHIFT);
    tcg_gen_movcond_i64_mips64(tcg_ctx,TCG_COND_EQ,ret,val,ret,newv,val);
    tcg_gen_qemu_st_i64_mips64(tcg_ctx,ret,addr,idx,opc);
    tcg_temp_free_internal_mips64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    if ((opc & MO_ASHIFT) == MO_8) {
      tcg_gen_mov_i64_mips64(tcg_ctx,retv,val);
    }
    else {
      tcg_gen_ext_i64(tcg_ctx,retv,val,opc);
    }
    tcg_temp_free_internal_mips64(tcg_ctx,(TCGTemp *)(val + (long)tcg_ctx));
    return;
  }
  if ((~opc & 3) == 0) {
    gen_helper_exit_atomic(tcg_ctx,tcg_ctx->cpu_env);
    tcg_gen_movi_i64_mips64(tcg_ctx,retv,0);
    return;
  }
  ret_00 = tcg_temp_new_i32(tcg_ctx);
  ret_01 = tcg_temp_new_i32(tcg_ctx);
  retv_00 = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_mov_i32(tcg_ctx,ret_00,(TCGv_i32)cmpv);
  tcg_gen_mov_i32(tcg_ctx,ret_01,(TCGv_i32)newv);
  tcg_gen_atomic_cmpxchg_i32_mips64(tcg_ctx,retv_00,addr,ret_00,ret_01,idx,opc & ~MO_ASHIFT);
  tcg_temp_free_internal_mips64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  tcg_temp_free_internal_mips64(tcg_ctx,(TCGTemp *)(ret_01 + (long)tcg_ctx));
  tcg_gen_extu_i32_i64_mips64(tcg_ctx,retv,retv_00);
  tcg_temp_free_internal_mips64(tcg_ctx,(TCGTemp *)(retv_00 + (long)tcg_ctx));
  if ((opc & MO_ASHIFT) == MO_8) {
    return;
  }
  tcg_gen_ext_i64(tcg_ctx,retv,retv,opc);
  return;
}

Assistant:

void tcg_gen_atomic_cmpxchg_i64(TCGContext *tcg_ctx, TCGv_i64 retv, TCGv addr, TCGv_i64 cmpv,
                                TCGv_i64 newv, TCGArg idx, MemOp memop)
{
    memop = tcg_canonicalize_memop(memop, 1, 0);

    if (!(tcg_ctx->tb_cflags & CF_PARALLEL)) {
        TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);

        tcg_gen_ext_i64(tcg_ctx, t2, cmpv, memop & MO_SIZE);

        tcg_gen_qemu_ld_i64(tcg_ctx, t1, addr, idx, memop & ~MO_SIGN);
        tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, t2, t1, t2, newv, t1);
        tcg_gen_qemu_st_i64(tcg_ctx, t2, addr, idx, memop);
        tcg_temp_free_i64(tcg_ctx, t2);

        if (memop & MO_SIGN) {
            tcg_gen_ext_i64(tcg_ctx, retv, t1, memop);
        } else {
            tcg_gen_mov_i64(tcg_ctx, retv, t1);
        }
        tcg_temp_free_i64(tcg_ctx, t1);
    } else if ((memop & MO_SIZE) == MO_64) {
#ifdef CONFIG_ATOMIC64
        gen_atomic_cx_i64 gen;

        gen = table_cmpxchg[memop & (MO_SIZE | MO_BSWAP)];
        tcg_debug_assert(gen != NULL);

        {
            TCGv_i32 oi = tcg_const_i32(tcg_ctx, make_memop_idx(memop, idx));
            gen(tcg_ctx, retv, tcg_ctx->cpu_env, addr, cmpv, newv, oi);
            tcg_temp_free_i32(tcg_ctx, oi);
        }
#else
        gen_helper_exit_atomic(tcg_ctx, tcg_ctx->cpu_env);
        /* Produce a result, so that we have a well-formed opcode stream
           with respect to uses of the result in the (dead) code following.  */
        tcg_gen_movi_i64(tcg_ctx, retv, 0);
#endif /* CONFIG_ATOMIC64 */
    } else {
        TCGv_i32 c32 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 n32 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 r32 = tcg_temp_new_i32(tcg_ctx);

        tcg_gen_extrl_i64_i32(tcg_ctx, c32, cmpv);
        tcg_gen_extrl_i64_i32(tcg_ctx, n32, newv);
        tcg_gen_atomic_cmpxchg_i32(tcg_ctx, r32, addr, c32, n32, idx, memop & ~MO_SIGN);
        tcg_temp_free_i32(tcg_ctx, c32);
        tcg_temp_free_i32(tcg_ctx, n32);

        tcg_gen_extu_i32_i64(tcg_ctx, retv, r32);
        tcg_temp_free_i32(tcg_ctx, r32);

        if (memop & MO_SIGN) {
            tcg_gen_ext_i64(tcg_ctx, retv, retv, memop);
        }
    }
}